

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall
HdlcAnalyzer::ProcessFcsField(HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *fcs)

{
  HdlcFcsType HVar1;
  const_iterator cVar2;
  pointer puVar3;
  U64 UVar4;
  U64 UVar5;
  HdlcAnalyzer *this_00;
  Frame frame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> calculatedFcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readFcs;
  
  calculatedFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  calculatedFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  calculatedFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (HdlcAnalyzer *)&readFcs;
  HdlcBytesToVectorBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(HdlcAnalyzer *)fcs,
             fcs);
  HVar1 = ((this->mSettings)._M_ptr)->mHdlcFcs;
  if (HVar1 == HDLC_CRC8) {
    puVar3 = (this->mCurrentFrameBytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != puVar3) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
    }
    HdlcSimulationDataGenerator::Crc8
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&frame,
               &this->mCurrentFrameBytes);
  }
  else if (HVar1 == HDLC_CRC16) {
    cVar2._M_current =
         (this->mCurrentFrameBytes).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (1 < (ulong)((long)cVar2._M_current -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&this->mCurrentFrameBytes,(const_iterator)(cVar2._M_current + -2),cVar2);
    }
    HdlcSimulationDataGenerator::Crc16
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&frame,
               &this->mCurrentFrameBytes);
  }
  else {
    if (HVar1 != HDLC_CRC32) goto LAB_0010a8f4;
    cVar2._M_current =
         (this->mCurrentFrameBytes).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (3 < (ulong)((long)cVar2._M_current -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&this->mCurrentFrameBytes,(const_iterator)(cVar2._M_current + -4),cVar2);
    }
    HdlcSimulationDataGenerator::Crc32
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&frame,
               &this->mCurrentFrameBytes);
  }
  this_00 = (HdlcAnalyzer *)&frame;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&calculatedFcs,this_00)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
LAB_0010a8f4:
  UVar4 = ((fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
           super__Vector_impl_data._M_start)->startSample;
  UVar5 = (fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1].endSample;
  VectorToValue(this_00,&readFcs);
  VectorToValue(this_00,&calculatedFcs);
  Frame::Frame(&frame);
  _frame = UVar4;
  std::operator!=(&calculatedFcs,&readFcs);
  std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
  AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,(MarkerType)UVar5,(Channel *)0x9);
  Frame::~Frame(&frame);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&calculatedFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void HdlcAnalyzer::ProcessFcsField( const vector<HdlcByte>& fcs )
{
    vector<U8> calculatedFcs;
    vector<U8> readFcs = HdlcBytesToVectorBytes( fcs );

    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
    {
        if( !mCurrentFrameBytes.empty() )
        {
            mCurrentFrameBytes.pop_back();
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc8( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC16:
    {
        if( mCurrentFrameBytes.size() >= 2 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 2, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc16( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC32:
    {
        if( mCurrentFrameBytes.size() >= 4 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 4, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc32( mCurrentFrameBytes );
        break;
    }
    }

    Frame frame = CreateFrame( HDLC_FIELD_FCS, fcs.front().startSample, fcs.back().endSample, VectorToValue( readFcs ),
                               VectorToValue( calculatedFcs ) );

    if( calculatedFcs != readFcs )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }

    AddFrameToResults( frame );

    // Put a marker in the end of the HDLC frame
    mResults->AddMarker( frame.mEndingSampleInclusive, AnalyzerResults::Stop, mSettings->mInputChannel );
}